

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_add_flags_extension(CBB *cbb,SSLFlags flags)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  CBB child;
  CBB body;
  CBB CStack_78;
  CBB local_48;
  
  if (flags == 0) {
    return true;
  }
  uVar3 = (ulong)flags;
  iVar1 = CBB_add_u16(cbb,0x3e);
  if (((iVar1 == 0) || (iVar1 = CBB_add_u16_length_prefixed(cbb,&local_48), iVar1 == 0)) ||
     (iVar1 = CBB_add_u8_length_prefixed(&local_48,&CStack_78), iVar1 == 0)) {
LAB_00243a40:
    bVar4 = false;
  }
  else {
    do {
      iVar1 = CBB_add_u8(&CStack_78,(uint8_t)uVar3);
      if (iVar1 == 0) goto LAB_00243a40;
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 8;
    } while (0xff < uVar2);
    iVar1 = CBB_flush(cbb);
    bVar4 = iVar1 != 0;
  }
  return bVar4;
}

Assistant:

bool ssl_add_flags_extension(CBB *cbb, SSLFlags flags) {
  if (flags == 0) {
    return true;
  }

  CBB body, child;
  if (!CBB_add_u16(cbb, TLSEXT_TYPE_tls_flags) ||
      !CBB_add_u16_length_prefixed(cbb, &body) ||
      !CBB_add_u8_length_prefixed(&body, &child)) {
    return false;
  }

  while (flags != 0) {
    if (!CBB_add_u8(&child, static_cast<uint8_t>(flags))) {
      return false;
    }
    flags >>= 8;
  }

  return CBB_flush(cbb);
}